

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_Prewitt(PrewittForm1 Prewitt)

{
  bool bVar1;
  Image output;
  Image input;
  ImageTemplate<unsigned_char> local_68;
  Image local_40;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_40,0,0,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  bVar1 = true;
  if ((2 < local_40._width) && (2 < local_40._height)) {
    (*Prewitt)(&local_68,&local_40);
    if (((local_40._height == local_68._height) &&
        (((local_40._width == local_68._width && (local_40._alignment == local_68._alignment)) &&
         (local_40._colorCount == local_68._colorCount)))) &&
       (local_40._rowSize == local_68._rowSize)) {
      bVar1 = Unit_Test::verifyImage(&local_68,'\0');
    }
    else {
      bVar1 = false;
    }
    local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  }
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  return bVar1;
}

Assistant:

bool form1_Prewitt(PrewittForm1 Prewitt)
    {
        const PenguinV_Image::Image input = uniformImage();
        if ( (input.width() < 3) || (input.height() < 3) )
            return true;

        const PenguinV_Image::Image output = Prewitt( input );

        return equalSize( input, output ) && verifyImage( output, 0u );
    }